

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse4.cpp
# Opt level: O0

void convertARGBToARGB32PM_sse4<false>(uint *buffer,uint *src,int count)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  QRgb QVar7;
  undefined1 (*pauVar8) [16];
  undefined8 *puVar9;
  int in_EDX;
  undefined1 in_SIL;
  undefined7 in_register_00000031;
  long in_RDI;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint v;
  int _i;
  __m128i alpha2;
  __m128i alpha1;
  __m128i src2;
  __m128i src1;
  __m128i srcVector;
  __m128i zero;
  __m128i half;
  __m128i shuffleMask;
  __m128i rgbaMask;
  __m128i alphaMask;
  int i;
  QRgb x;
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  int local_398;
  byte local_2e8;
  byte bStack_2e7;
  byte bStack_2e6;
  byte bStack_2e5;
  byte bStack_2e4;
  byte bStack_2e3;
  byte bStack_2e2;
  byte bStack_2e1;
  byte bStack_2c0;
  byte bStack_2bf;
  byte bStack_2be;
  byte bStack_2bd;
  byte bStack_2bc;
  byte bStack_2bb;
  byte bStack_2ba;
  byte bStack_2b9;
  short local_278;
  short sStack_276;
  short sStack_274;
  short sStack_272;
  short sStack_270;
  short sStack_26e;
  short sStack_26c;
  short sStack_26a;
  ushort uStack_266;
  ushort uStack_264;
  ushort uStack_262;
  ushort uStack_260;
  ushort uStack_25e;
  ushort uStack_25c;
  ushort uStack_25a;
  short local_258;
  short sStack_256;
  short sStack_254;
  short sStack_252;
  short sStack_250;
  short sStack_24e;
  short sStack_24c;
  short sStack_24a;
  ushort uStack_246;
  ushort uStack_244;
  ushort uStack_242;
  ushort uStack_240;
  ushort uStack_23e;
  ushort uStack_23c;
  ushort uStack_23a;
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_130;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  short local_128;
  short sStack_126;
  short sStack_124;
  short sStack_122;
  short sStack_120;
  short sStack_11e;
  short sStack_11c;
  short sStack_11a;
  
  for (local_398 = 0; local_398 < in_EDX + -3; local_398 = local_398 + 4) {
    pauVar8 = (undefined1 (*) [16])(CONCAT71(in_register_00000031,in_SIL) + (long)local_398 * 4);
    uVar1 = *(undefined8 *)*pauVar8;
    uVar2 = *(undefined8 *)(*pauVar8 + 8);
    auVar10._8_8_ = 0xff000000ff000000;
    auVar10._0_8_ = 0xff000000ff000000;
    if ((auVar10 & *pauVar8) == (undefined1  [16])0x0) {
      puVar9 = (undefined8 *)(in_RDI + (long)local_398 * 4);
      *puVar9 = 0;
      puVar9[1] = 0;
    }
    else {
      auVar11._8_8_ = 0xff000000ff000000;
      auVar11._0_8_ = 0xff000000ff000000;
      if ((auVar11 & ~*pauVar8) == (undefined1  [16])0x0) {
        if (in_RDI != CONCAT71(in_register_00000031,in_SIL)) {
          puVar9 = (undefined8 *)(in_RDI + (long)local_398 * 4);
          *puVar9 = uVar1;
          puVar9[1] = uVar2;
        }
      }
      else {
        local_2e8 = (byte)uVar1;
        bStack_2e7 = (byte)((ulong)uVar1 >> 8);
        bStack_2e6 = (byte)((ulong)uVar1 >> 0x10);
        bStack_2e5 = (byte)((ulong)uVar1 >> 0x18);
        bStack_2e4 = (byte)((ulong)uVar1 >> 0x20);
        bStack_2e3 = (byte)((ulong)uVar1 >> 0x28);
        bStack_2e2 = (byte)((ulong)uVar1 >> 0x30);
        bStack_2e1 = (byte)((ulong)uVar1 >> 0x38);
        local_408[1] = 0;
        local_408[0] = local_2e8;
        local_408[2] = bStack_2e7;
        local_408[3] = 0;
        local_408[4] = bStack_2e6;
        local_408[5] = 0;
        local_408[6] = bStack_2e5;
        local_408[7] = 0;
        local_408[8] = bStack_2e4;
        local_408[9] = 0;
        local_408[10] = bStack_2e3;
        local_408[0xb] = 0;
        local_408[0xc] = bStack_2e2;
        local_408[0xd] = 0;
        local_408[0xe] = bStack_2e1;
        bStack_2c0 = (byte)uVar2;
        bStack_2bf = (byte)((ulong)uVar2 >> 8);
        bStack_2be = (byte)((ulong)uVar2 >> 0x10);
        bStack_2bd = (byte)((ulong)uVar2 >> 0x18);
        bStack_2bc = (byte)((ulong)uVar2 >> 0x20);
        bStack_2bb = (byte)((ulong)uVar2 >> 0x28);
        bStack_2ba = (byte)((ulong)uVar2 >> 0x30);
        bStack_2b9 = (byte)((ulong)uVar2 >> 0x38);
        local_418[1] = 0;
        local_418[0] = bStack_2c0;
        local_418[2] = bStack_2bf;
        local_418[3] = 0;
        local_418[4] = bStack_2be;
        local_418[5] = 0;
        local_418[6] = bStack_2bd;
        local_418[7] = 0;
        local_418[8] = bStack_2bc;
        local_418[9] = 0;
        local_418[10] = bStack_2bb;
        local_418[0xb] = 0;
        local_418[0xc] = bStack_2ba;
        local_418[0xd] = 0;
        local_418[0xe] = bStack_2b9;
        auVar6._8_7_ = local_408._8_7_;
        auVar6._0_8_ = local_408._0_8_;
        auVar6[0xf] = 0;
        auVar5._8_8_ = 0xf0e0f0e0f0e0f0e;
        auVar5._0_8_ = 0x706070607060706;
        auVar11 = pshufb(auVar6,auVar5);
        auVar4._8_7_ = local_418._8_7_;
        auVar4._0_8_ = local_418._0_8_;
        auVar4[0xf] = 0;
        auVar3._8_8_ = 0xf0e0f0e0f0e0f0e;
        auVar3._0_8_ = 0x706070607060706;
        auVar10 = pshufb(auVar4,auVar3);
        uStack_246 = (ushort)bStack_2e7;
        uStack_244 = (ushort)bStack_2e6;
        uStack_242 = (ushort)bStack_2e5;
        uStack_240 = (ushort)bStack_2e4;
        uStack_23e = (ushort)bStack_2e3;
        uStack_23c = (ushort)bStack_2e2;
        uStack_23a = (ushort)bStack_2e1;
        local_258 = auVar11._0_2_;
        sStack_256 = auVar11._2_2_;
        sStack_254 = auVar11._4_2_;
        sStack_252 = auVar11._6_2_;
        sStack_250 = auVar11._8_2_;
        sStack_24e = auVar11._10_2_;
        sStack_24c = auVar11._12_2_;
        sStack_24a = auVar11._14_2_;
        uStack_266 = (ushort)bStack_2bf;
        uStack_264 = (ushort)bStack_2be;
        uStack_262 = (ushort)bStack_2bd;
        uStack_260 = (ushort)bStack_2bc;
        uStack_25e = (ushort)bStack_2bb;
        uStack_25c = (ushort)bStack_2ba;
        uStack_25a = (ushort)bStack_2b9;
        local_278 = auVar10._0_2_;
        sStack_276 = auVar10._2_2_;
        sStack_274 = auVar10._4_2_;
        sStack_272 = auVar10._6_2_;
        sStack_270 = auVar10._8_2_;
        sStack_26e = auVar10._10_2_;
        sStack_26c = auVar10._12_2_;
        sStack_26a = auVar10._14_2_;
        local_408._2_2_ =
             (ushort)(uStack_246 * sStack_256 + ((ushort)(uStack_246 * sStack_256) >> 8) + 0x80) >>
             8;
        local_408._0_2_ =
             (ushort)(local_408._0_2_ * local_258 + ((ushort)(local_408._0_2_ * local_258) >> 8) +
                     0x80) >> 8;
        local_408._4_2_ =
             (ushort)(uStack_244 * sStack_254 + ((ushort)(uStack_244 * sStack_254) >> 8) + 0x80) >>
             8;
        local_408._6_2_ =
             (ushort)(uStack_242 * sStack_252 + ((ushort)(uStack_242 * sStack_252) >> 8) + 0x80) >>
             8;
        local_408._8_2_ =
             (ushort)(uStack_240 * sStack_250 + ((ushort)(uStack_240 * sStack_250) >> 8) + 0x80) >>
             8;
        local_408._10_2_ =
             (ushort)(uStack_23e * sStack_24e + ((ushort)(uStack_23e * sStack_24e) >> 8) + 0x80) >>
             8;
        local_408._12_2_ =
             (ushort)(uStack_23c * sStack_24c + ((ushort)(uStack_23c * sStack_24c) >> 8) + 0x80) >>
             8;
        local_408._14_2_ =
             (ushort)(uStack_23a * sStack_24a + ((ushort)(uStack_23a * sStack_24a) >> 8) + 0x80) >>
             8;
        local_418._2_2_ =
             (ushort)(uStack_266 * sStack_276 + ((ushort)(uStack_266 * sStack_276) >> 8) + 0x80) >>
             8;
        local_418._0_2_ =
             (ushort)(local_418._0_2_ * local_278 + ((ushort)(local_418._0_2_ * local_278) >> 8) +
                     0x80) >> 8;
        local_418._4_2_ =
             (ushort)(uStack_264 * sStack_274 + ((ushort)(uStack_264 * sStack_274) >> 8) + 0x80) >>
             8;
        local_418._6_2_ =
             (ushort)(uStack_262 * sStack_272 + ((ushort)(uStack_262 * sStack_272) >> 8) + 0x80) >>
             8;
        local_418._8_2_ =
             (ushort)(uStack_260 * sStack_270 + ((ushort)(uStack_260 * sStack_270) >> 8) + 0x80) >>
             8;
        local_418._10_2_ =
             (ushort)(uStack_25e * sStack_26e + ((ushort)(uStack_25e * sStack_26e) >> 8) + 0x80) >>
             8;
        local_418._12_2_ =
             (ushort)(uStack_25c * sStack_26c + ((ushort)(uStack_25c * sStack_26c) >> 8) + 0x80) >>
             8;
        local_418._14_2_ =
             (ushort)(uStack_25a * sStack_26a + ((ushort)(uStack_25a * sStack_26a) >> 8) + 0x80) >>
             8;
        auVar11 = pblendw(local_408,auVar11,0x88);
        auVar10 = pblendw(local_418,auVar10,0x88);
        local_128 = auVar11._0_2_;
        sStack_126 = auVar11._2_2_;
        sStack_124 = auVar11._4_2_;
        sStack_122 = auVar11._6_2_;
        sStack_120 = auVar11._8_2_;
        sStack_11e = auVar11._10_2_;
        sStack_11c = auVar11._12_2_;
        sStack_11a = auVar11._14_2_;
        local_138 = auVar10._0_2_;
        sStack_136 = auVar10._2_2_;
        sStack_134 = auVar10._4_2_;
        sStack_132 = auVar10._6_2_;
        sStack_130 = auVar10._8_2_;
        sStack_12e = auVar10._10_2_;
        sStack_12c = auVar10._12_2_;
        sStack_12a = auVar10._14_2_;
        local_3f8 = CONCAT17((0 < sStack_11a) * (sStack_11a < 0x100) * auVar11[0xe] -
                             (0xff < sStack_11a),
                             CONCAT16((0 < sStack_11c) * (sStack_11c < 0x100) * auVar11[0xc] -
                                      (0xff < sStack_11c),
                                      CONCAT15((0 < sStack_11e) * (sStack_11e < 0x100) * auVar11[10]
                                               - (0xff < sStack_11e),
                                               CONCAT14((0 < sStack_120) * (sStack_120 < 0x100) *
                                                        auVar11[8] - (0xff < sStack_120),
                                                        CONCAT13((0 < sStack_122) *
                                                                 (sStack_122 < 0x100) * auVar11[6] -
                                                                 (0xff < sStack_122),
                                                                 CONCAT12((0 < sStack_124) *
                                                                          (sStack_124 < 0x100) *
                                                                          auVar11[4] -
                                                                          (0xff < sStack_124),
                                                                          CONCAT11((0 < sStack_126)
                                                                                   * (sStack_126 <
                                                                                     0x100) *
                                                                                   auVar11[2] -
                                                                                   (0xff < 
                                                  sStack_126),
                                                  (0 < local_128) * (local_128 < 0x100) * auVar11[0]
                                                  - (0xff < local_128))))))));
        uStack_3f0 = CONCAT17((0 < sStack_12a) * (sStack_12a < 0x100) * auVar10[0xe] -
                              (0xff < sStack_12a),
                              CONCAT16((0 < sStack_12c) * (sStack_12c < 0x100) * auVar10[0xc] -
                                       (0xff < sStack_12c),
                                       CONCAT15((0 < sStack_12e) * (sStack_12e < 0x100) *
                                                auVar10[10] - (0xff < sStack_12e),
                                                CONCAT14((0 < sStack_130) * (sStack_130 < 0x100) *
                                                         auVar10[8] - (0xff < sStack_130),
                                                         CONCAT13((0 < sStack_132) *
                                                                  (sStack_132 < 0x100) * auVar10[6]
                                                                  - (0xff < sStack_132),
                                                                  CONCAT12((0 < sStack_134) *
                                                                           (sStack_134 < 0x100) *
                                                                           auVar10[4] -
                                                                           (0xff < sStack_134),
                                                                           CONCAT11((0 < sStack_136)
                                                                                    * (sStack_136 <
                                                                                      0x100) *
                                                                                    auVar10[2] -
                                                                                    (0xff < 
                                                  sStack_136),
                                                  (0 < local_138) * (local_138 < 0x100) * auVar10[0]
                                                  - (0xff < local_138))))))));
        puVar9 = (undefined8 *)(in_RDI + (long)local_398 * 4);
        *puVar9 = local_3f8;
        puVar9[1] = uStack_3f0;
      }
    }
  }
  for (x = 0; (int)x < 3 && local_398 < in_EDX; x = x + 1) {
    QVar7 = qPremultiply(x);
    *(QRgb *)(in_RDI + (long)local_398 * 4) = QVar7;
    local_398 = local_398 + 1;
  }
  return;
}

Assistant:

static void convertARGBToARGB32PM_sse4(uint *buffer, const uint *src, int count)
{
    int i = 0;
    const __m128i alphaMask = _mm_set1_epi32(0xff000000);
    const __m128i rgbaMask = _mm_setr_epi8(2, 1, 0, 3, 6, 5, 4, 7, 10, 9, 8, 11, 14, 13, 12, 15);
    const __m128i shuffleMask = _mm_setr_epi8(6, 7, 6, 7, 6, 7, 6, 7, 14, 15, 14, 15, 14, 15, 14, 15);
    const __m128i half = _mm_set1_epi16(0x0080);
    const __m128i zero = _mm_setzero_si128();

    for (; i < count - 3; i += 4) {
        __m128i srcVector = _mm_loadu_si128((const __m128i *)&src[i]);
        if (!_mm_testz_si128(srcVector, alphaMask)) {
            if (!_mm_testc_si128(srcVector, alphaMask)) {
                if (RGBA)
                    srcVector = _mm_shuffle_epi8(srcVector, rgbaMask);
                __m128i src1 = _mm_unpacklo_epi8(srcVector, zero);
                __m128i src2 = _mm_unpackhi_epi8(srcVector, zero);
                __m128i alpha1 = _mm_shuffle_epi8(src1, shuffleMask);
                __m128i alpha2 = _mm_shuffle_epi8(src2, shuffleMask);
                src1 = _mm_mullo_epi16(src1, alpha1);
                src2 = _mm_mullo_epi16(src2, alpha2);
                src1 = _mm_add_epi16(src1, _mm_srli_epi16(src1, 8));
                src2 = _mm_add_epi16(src2, _mm_srli_epi16(src2, 8));
                src1 = _mm_add_epi16(src1, half);
                src2 = _mm_add_epi16(src2, half);
                src1 = _mm_srli_epi16(src1, 8);
                src2 = _mm_srli_epi16(src2, 8);
                src1 = _mm_blend_epi16(src1, alpha1, 0x88);
                src2 = _mm_blend_epi16(src2, alpha2, 0x88);
                srcVector = _mm_packus_epi16(src1, src2);
                _mm_storeu_si128((__m128i *)&buffer[i], srcVector);
            } else {
                if (RGBA)
                    _mm_storeu_si128((__m128i *)&buffer[i], _mm_shuffle_epi8(srcVector, rgbaMask));
                else if (buffer != src)
                    _mm_storeu_si128((__m128i *)&buffer[i], srcVector);
            }
        } else {
            _mm_storeu_si128((__m128i *)&buffer[i], zero);
        }
    }

    SIMD_EPILOGUE(i, count, 3) {
        uint v = qPremultiply(src[i]);
        buffer[i] = RGBA ? RGBA2ARGB(v) : v;
    }
}